

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__2,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  long *plVar1;
  char (*in_stack_fffffffffffffeb8) [38];
  undefined1 local_140 [80];
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  plVar1 = *(long **)(this + 8);
  local_140._32_16_ = (undefined1  [16])NullSafeStringView("Option \"");
  local_60.piece_._M_str = (char *)**(undefined8 **)this;
  local_60.piece_._M_len = (*(undefined8 **)this)[1];
  local_90.piece_ = NullSafeStringView("\" is resolved to \"(");
  local_c0.piece_._M_str = *(char **)(*plVar1 + 0x150);
  local_c0.piece_._M_len = *(size_t *)(*plVar1 + 0x158);
  local_f0.piece_ =
       NullSafeStringView(
                         ")\", which is not defined. The innermost scope is searched first in name resolution. Consider using a leading \'.\'(i.e., \"(."
                         );
  std::__cxx11::string::substr((ulong)local_140,*(ulong *)this);
  StrCat<std::__cxx11::string,char[38]>
            (__return_storage_ptr__,(lts_20250127 *)(local_140 + 0x20),&local_60,&local_90,&local_c0
             ,&local_f0,(AlphaNum *)local_140,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             "\") to start from the outermost scope.",in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string((string *)local_140);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}